

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O2

CATNNode<wchar_t> *
std::__uninitialized_copy<false>::
__uninit_copy<Centaurus::CATNNode<wchar_t>const*,Centaurus::CATNNode<wchar_t>*>
          (CATNNode<wchar_t> *__first,CATNNode<wchar_t> *__last,CATNNode<wchar_t> *__result)

{
  for (; __first != __last; __first = __first + 1) {
    Centaurus::CATNNode<wchar_t>::CATNNode(__result,__first);
    __result = __result + 1;
  }
  return __result;
}

Assistant:

CharClass(wchar_t start, wchar_t end)
    {
        m_ranges.push_back(Range<TCHAR>::make_from_wide(start, end));
    }